

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int isEVD(iso9660 *iso9660,uchar *h)

{
  uint16_t uVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int32_t location;
  int32_t volume_block;
  ssize_t logical_block_size;
  uchar *p;
  uchar *h_local;
  iso9660 *iso9660_local;
  
  if (*h == '\x02') {
    if (h[6] == '\x02') {
      if (h[7] == '\0') {
        iVar2 = isNull(iso9660,h,0x48,8);
        if (iVar2 == 0) {
          iso9660_local._4_4_ = 0;
        }
        else {
          iVar2 = isNull(iso9660,h,0x58,0x20);
          if (iVar2 == 0) {
            iso9660_local._4_4_ = 0;
          }
          else {
            uVar1 = archive_le16dec(h + 0x80);
            if (uVar1 == 0) {
              iso9660_local._4_4_ = 0;
            }
            else {
              uVar3 = archive_le32dec(h + 0x50);
              if ((int)uVar3 < 0x15) {
                iso9660_local._4_4_ = 0;
              }
              else if (h[0x371] == '\x02') {
                uVar4 = archive_le32dec(h + 0x8c);
                if (((int)uVar4 < 0x12) || ((int)uVar3 <= (int)uVar4)) {
                  iso9660_local._4_4_ = 0;
                }
                else {
                  uVar4 = archive_be32dec(h + 0x94);
                  if ((((int)uVar4 < 1) || (0x11 < (int)uVar4)) && ((int)uVar4 < (int)uVar3)) {
                    iVar2 = isNull(iso9660,h,0x372,1);
                    if (iVar2 == 0) {
                      iso9660_local._4_4_ = 0;
                    }
                    else {
                      iVar2 = isNull(iso9660,h,0x573,0x28d);
                      if (iVar2 == 0) {
                        iso9660_local._4_4_ = 0;
                      }
                      else if (h[0x9c] == '\"') {
                        iso9660_local._4_4_ = 0x30;
                      }
                      else {
                        iso9660_local._4_4_ = 0;
                      }
                    }
                  }
                  else {
                    iso9660_local._4_4_ = 0;
                  }
                }
              }
              else {
                iso9660_local._4_4_ = 0;
              }
            }
          }
        }
      }
      else {
        iso9660_local._4_4_ = 0;
      }
    }
    else {
      iso9660_local._4_4_ = 0;
    }
  }
  else {
    iso9660_local._4_4_ = 0;
  }
  return iso9660_local._4_4_;
}

Assistant:

static int
isEVD(struct iso9660 *iso9660, const unsigned char *h)
{
	const unsigned char *p;
	ssize_t logical_block_size;
	int32_t volume_block;
	int32_t location;

	(void)iso9660; /* UNUSED */

	/* Type of the Enhanced Volume Descriptor must be 2. */
	if (h[PVD_type_offset] != 2)
		return (0);

	/* EVD version must be 2. */
	if (h[PVD_version_offset] != 2)
		return (0);

	/* Reserved field must be 0. */
	if (h[PVD_reserved1_offset] != 0)
		return (0);

	/* Reserved field must be 0. */
	if (!isNull(iso9660, h, PVD_reserved2_offset, PVD_reserved2_size))
		return (0);

	/* Reserved field must be 0. */
	if (!isNull(iso9660, h, PVD_reserved3_offset, PVD_reserved3_size))
		return (0);

	/* Logical block size must be > 0. */
	/* I've looked at Ecma 119 and can't find any stronger
	 * restriction on this field. */
	logical_block_size =
	    archive_le16dec(h + PVD_logical_block_size_offset);
	if (logical_block_size <= 0)
		return (0);

	volume_block =
	    archive_le32dec(h + PVD_volume_space_size_offset);
	if (volume_block <= SYSTEM_AREA_BLOCK+4)
		return (0);

	/* File structure version must be 2 for ISO9660:1999. */
	if (h[PVD_file_structure_version_offset] != 2)
		return (0);

	/* Location of Occurrence of Type L Path Table must be
	 * available location,
	 * >= SYSTEM_AREA_BLOCK(16) + 2 and < Volume Space Size. */
	location = archive_le32dec(h+PVD_type_1_path_table_offset);
	if (location < SYSTEM_AREA_BLOCK+2 || location >= volume_block)
		return (0);

	/* Location of Occurrence of Type M Path Table must be
	 * available location,
	 * >= SYSTEM_AREA_BLOCK(16) + 2 and < Volume Space Size. */
	location = archive_be32dec(h+PVD_type_m_path_table_offset);
	if ((location > 0 && location < SYSTEM_AREA_BLOCK+2)
	    || location >= volume_block)
		return (0);

	/* Reserved field must be 0. */
	if (!isNull(iso9660, h, PVD_reserved4_offset, PVD_reserved4_size))
		return (0);

	/* Reserved field must be 0. */
	if (!isNull(iso9660, h, PVD_reserved5_offset, PVD_reserved5_size))
		return (0);

	/* Read Root Directory Record in Volume Descriptor. */
	p = h + PVD_root_directory_record_offset;
	if (p[DR_length_offset] != 34)
		return (0);

	return (48);
}